

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign_extension.c
# Opt level: O0

uint64_t sign_extend_64(uint64_t v,int old,int new)

{
  ulong uVar1;
  int in_EDX;
  int in_ESI;
  ulong in_RDI;
  _Bool s;
  uint64_t mask;
  uint64_t local_8;
  
  if (in_ESI <= in_EDX) {
    uVar1 = in_RDI & (long)(1 << ((char)in_ESI - 1U & 0x1f));
    local_8 = in_RDI;
    if (uVar1 != 0) {
      local_8 = (in_RDI ^ uVar1) - uVar1;
    }
    return local_8;
  }
  fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
          "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/sign_extension.c"
          ,6);
  fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m",
          "Can\'t downsize signed values with this function!");
  exit(1);
}

Assistant:

uint64_t sign_extend_64(uint64_t v, int old, int new) {
    unimplemented(new < old, "Can't downsize signed values with this function!")

    uint64_t mask = v & (1 << (old - 1));
    bool s = mask > 0;
    if (s) {
        return (v ^ mask) - mask;
    }
    else {
        return v; // No sign bit set, don't need to sign extend
    }
}